

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_> *
GetRandomNodeEvictionCandidates
          (vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>
           *__return_storage_ptr__,int n_candidates,FastRandomContext *random_context)

{
  int iVar1;
  uint uVar2;
  unsigned_long uVar3;
  ulong uVar4;
  ulong uVar5;
  long in_FS_OFFSET;
  NodeEvictionCandidate local_80;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->
  super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::reserve
            (__return_storage_ptr__,(long)n_candidates);
  uVar4 = 0;
  uVar5 = (ulong)(uint)n_candidates;
  if (n_candidates < 1) {
    uVar5 = uVar4;
  }
  for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    local_80.id = uVar4;
    iVar1 = RandomMixin<FastRandomContext>::randrange<int>
                      (&random_context->super_RandomMixin<FastRandomContext>,100);
    local_80.m_connected.__r = (rep)iVar1;
    iVar1 = RandomMixin<FastRandomContext>::randrange<int>
                      (&random_context->super_RandomMixin<FastRandomContext>,100);
    local_80.m_min_ping_time.__r = (rep)iVar1;
    iVar1 = RandomMixin<FastRandomContext>::randrange<int>
                      (&random_context->super_RandomMixin<FastRandomContext>,100);
    local_80.m_last_block_time.__r = (rep)iVar1;
    iVar1 = RandomMixin<FastRandomContext>::randrange<int>
                      (&random_context->super_RandomMixin<FastRandomContext>,100);
    local_80.m_last_tx_time.__r = (rep)iVar1;
    local_80.fRelevantServices =
         RandomMixin<FastRandomContext>::randbool
                   (&random_context->super_RandomMixin<FastRandomContext>);
    local_80.m_relay_txs =
         RandomMixin<FastRandomContext>::randbool
                   (&random_context->super_RandomMixin<FastRandomContext>);
    local_80.fBloomFilter =
         RandomMixin<FastRandomContext>::randbool
                   (&random_context->super_RandomMixin<FastRandomContext>);
    uVar2 = RandomMixin<FastRandomContext>::randrange<unsigned_int>
                      (&random_context->super_RandomMixin<FastRandomContext>,100);
    local_80.nKeyedNetGroup = (uint64_t)uVar2;
    local_80.prefer_evict =
         RandomMixin<FastRandomContext>::randbool
                   (&random_context->super_RandomMixin<FastRandomContext>);
    local_80.m_is_local =
         RandomMixin<FastRandomContext>::randbool
                   (&random_context->super_RandomMixin<FastRandomContext>);
    uVar3 = RandomMixin<FastRandomContext>::randrange<unsigned_long>
                      (&random_context->super_RandomMixin<FastRandomContext>,7);
    local_80.m_network = ALL_NETWORKS._M_elems[uVar3];
    local_80.m_noban = false;
    local_80.m_conn_type = INBOUND;
    std::vector<NodeEvictionCandidate,_std::allocator<NodeEvictionCandidate>_>::
    emplace_back<NodeEvictionCandidate>(__return_storage_ptr__,&local_80);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<NodeEvictionCandidate> GetRandomNodeEvictionCandidates(int n_candidates, FastRandomContext& random_context)
{
    std::vector<NodeEvictionCandidate> candidates;
    candidates.reserve(n_candidates);
    for (int id = 0; id < n_candidates; ++id) {
        candidates.push_back({
            .id=id,
            .m_connected=std::chrono::seconds{random_context.randrange(100)},
            .m_min_ping_time=std::chrono::microseconds{random_context.randrange(100)},
            .m_last_block_time=std::chrono::seconds{random_context.randrange(100)},
            .m_last_tx_time=std::chrono::seconds{random_context.randrange(100)},
            .fRelevantServices=random_context.randbool(),
            .m_relay_txs=random_context.randbool(),
            .fBloomFilter=random_context.randbool(),
            .nKeyedNetGroup=random_context.randrange(100u),
            .prefer_evict=random_context.randbool(),
            .m_is_local=random_context.randbool(),
            .m_network=ALL_NETWORKS[random_context.randrange(ALL_NETWORKS.size())],
            .m_noban=false,
            .m_conn_type=ConnectionType::INBOUND,
        });
    }
    return candidates;
}